

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  IfcStructuralSurfaceMemberVarying *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x190,"IfcStructuralSurfaceMemberVarying");
  IfcStructuralSurfaceMember::IfcStructuralSurfaceMember
            (&this->super_IfcStructuralSurfaceMember,&PTR_construction_vtable_24__010b36e8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying,_2UL> *)
             &(this->super_IfcStructuralSurfaceMember).field_0x160,
             &PTR_construction_vtable_24__010b3870);
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x10b3590;
  *(undefined8 *)&this->field_0x190 = 0x10b36d0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x10b35b8;
  (this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x10b35e0;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x10b3608;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0x10b3630;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x10b3658;
  *(undefined8 *)
   &(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x10b3680;
  *(undefined8 *)&(this->super_IfcStructuralSurfaceMember).field_0x160 = 0x10b36a8;
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL> *)
             &(this->super_IfcStructuralSurfaceMember).field_0x170);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            (&this->VaryingThicknessLocation,(LazyObject *)0x0);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}